

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3FkRequired(Parse *pParse,Table *pTab,int *aChange,int chngRowid)

{
  char *zLeft;
  char *zRight;
  uint uVar1;
  int iVar2;
  HashElem *pHVar3;
  long lVar4;
  uint uVar5;
  FKey *pFVar6;
  
  uVar5 = 0;
  if ((pParse->db->flags & 0x4000) != 0) {
    if (aChange == (int *)0x0) {
      pHVar3 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0);
      uVar5 = 1;
      if (pHVar3->data == (void *)0x0) {
        uVar5 = (uint)(pTab->pFKey != (FKey *)0x0);
      }
    }
    else {
      pFVar6 = pTab->pFKey;
      if (pFVar6 == (FKey *)0x0) {
        uVar5 = 0;
      }
      else {
        zLeft = pTab->zName;
        uVar5 = 0;
        do {
          zRight = pFVar6->zTo;
          if (zLeft == (char *)0x0) {
            iVar2 = -(uint)(zRight != (char *)0x0);
          }
          else if (zRight == (char *)0x0) {
            iVar2 = 1;
          }
          else {
            iVar2 = sqlite3StrICmp(zLeft,zRight);
          }
          if (iVar2 == 0) {
            return 2;
          }
          uVar1 = uVar5;
          if (0 < (long)pFVar6->nCol) {
            lVar4 = 0;
            while( true ) {
              iVar2 = *(int *)((long)&pFVar6->aCol[0].iFrom + lVar4);
              uVar1 = 1;
              if (-1 < aChange[iVar2]) break;
              if (((chngRowid != 0) && (iVar2 == pTab->iPKey)) ||
                 (lVar4 = lVar4 + 0x10, uVar1 = uVar5, (long)pFVar6->nCol * 0x10 == lVar4)) break;
            }
          }
          uVar5 = uVar1;
          pFVar6 = pFVar6->pNextFrom;
        } while (pFVar6 != (FKey *)0x0);
      }
      pHVar3 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0);
      for (pFVar6 = (FKey *)pHVar3->data; pFVar6 != (FKey *)0x0; pFVar6 = pFVar6->pNextTo) {
        iVar2 = fkParentIsModified(pTab,pFVar6,aChange,chngRowid);
        if ((iVar2 != 0) && (uVar5 = 1, pFVar6->aAction[1] != '\0')) {
          return 2;
        }
      }
    }
  }
  return uVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkRequired(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being modified */
  int *aChange,                   /* Non-NULL for UPDATE operations */
  int chngRowid                   /* True for UPDATE that affects rowid */
){
  int eRet = 0;
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    if( !aChange ){
      /* A DELETE operation. Foreign key processing is required if the 
      ** table in question is either the child or parent table for any 
      ** foreign key constraint.  */
      eRet = (sqlite3FkReferences(pTab) || pTab->pFKey);
    }else{
      /* This is an UPDATE. Foreign key processing is only required if the
      ** operation modifies one or more child or parent key columns. */
      FKey *p;

      /* Check if any child key columns are being modified. */
      for(p=pTab->pFKey; p; p=p->pNextFrom){
        if( 0==sqlite3_stricmp(pTab->zName, p->zTo) ) return 2;
        if( fkChildIsModified(pTab, p, aChange, chngRowid) ){
          eRet = 1;
        }
      }

      /* Check if any parent key columns are being modified. */
      for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
        if( fkParentIsModified(pTab, p, aChange, chngRowid) ){
          if( p->aAction[1]!=OE_None ) return 2;
          eRet = 1;
        }
      }
    }
  }
  return eRet;
}